

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O0

char * Gia_ManToMiniLutAttr(Gia_Man_t *pGia,void *pMiniLut)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  char *pAttrs;
  int i;
  Mini_Lut_t *p;
  void *pMiniLut_local;
  Gia_Man_t *pGia_local;
  
  iVar1 = Mini_LutNodeNum((Mini_Lut_t *)pMiniLut);
  pcVar2 = (char *)calloc((long)iVar1,1);
  for (pAttrs._4_4_ = 1; iVar1 = Gia_ManObjNum(pGia), pAttrs._4_4_ < iVar1;
      pAttrs._4_4_ = pAttrs._4_4_ + 1) {
    iVar1 = Gia_ObjIsLut(pGia,pAttrs._4_4_);
    if ((iVar1 != 0) && (iVar1 = Gia_ObjLutIsMux(pGia,pAttrs._4_4_), iVar1 != 0)) {
      pGVar3 = Gia_ManObj(pGia,pAttrs._4_4_);
      pcVar2[pGVar3->Value] = '\x01';
    }
  }
  return pcVar2;
}

Assistant:

char * Gia_ManToMiniLutAttr( Gia_Man_t * pGia, void * pMiniLut )
{ 
    Mini_Lut_t * p = (Mini_Lut_t *)pMiniLut; int i;
    char * pAttrs = ABC_CALLOC( char, Mini_LutNodeNum(p) );
    Gia_ManForEachLut( pGia, i )
        if ( Gia_ObjLutIsMux(pGia, i) )
            pAttrs[Gia_ManObj(pGia, i)->Value] = 1;
    return pAttrs;
}